

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range_map.h
# Opt level: O2

string * bloaty::RangeMap::EntryDebugString
                   (string *__return_storage_ptr__,uint64_t addr,uint64_t size,uint64_t other_start,
                   string *label)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  string end;
  undefined1 local_160 [48];
  AlphaNum local_130;
  undefined1 local_100 [48];
  StringifySink local_d0;
  undefined1 local_b0 [24];
  char local_98 [8];
  AlphaNum local_90;
  AlphaNum local_60;
  
  if (size == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&end,"?",(allocator<char> *)local_160);
  }
  else {
    local_100._8_2_ = 0x3001;
    local_100._0_8_ = (pointer)(size + addr);
    local_160._16_8_ = 0;
    local_160._24_8_ = 0;
    local_160._8_8_ = 0;
    local_160._0_8_ = local_160 + 0x10;
    local_130.piece_ =
         absl::strings_internal::ExtractStringification<absl::Hex>
                   ((StringifySink *)local_160,(Hex *)local_100);
    absl::StrCat_abi_cxx11_(&end,(absl *)&local_130,(AlphaNum *)local_130.piece_._M_str);
    std::__cxx11::string::~string((string *)local_160);
  }
  local_130.piece_ = absl::NullSafeStringView("[");
  local_98[0] = '\x01';
  local_98[1] = '0';
  local_d0.buffer_._M_dataplus._M_p = (pointer)&local_d0.buffer_.field_2;
  local_d0.buffer_.field_2._M_allocated_capacity = 0;
  local_d0.buffer_.field_2._8_8_ = 0;
  local_d0.buffer_._M_string_length = 0;
  local_b0._16_8_ = addr;
  local_160._0_16_ =
       (undefined1  [16])
       absl::strings_internal::ExtractStringification<absl::Hex>(&local_d0,(Hex *)(local_b0 + 0x10))
  ;
  local_100._0_16_ = (undefined1  [16])absl::NullSafeStringView(", ");
  local_90.piece_._M_len = end._M_string_length;
  local_90.piece_._M_str = end._M_dataplus._M_p;
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x175538;
  local_60.piece_ = absl::NullSafeStringView("] (size=");
  local_b0._8_2_ = 0x3001;
  local_b0._0_8_ = size;
  absl::StrCat<absl::Hex,char[4],std::__cxx11::string>
            (__return_storage_ptr__,(absl *)&local_130,(AlphaNum *)local_160,(AlphaNum *)local_100,
             &local_90,&local_60,(AlphaNum *)local_b0,(Hex *)0x5598f4,(char (*) [4])label,args_2);
  std::__cxx11::string::~string((string *)&local_d0);
  if (other_start != 0xffffffffffffffff) {
    local_130.piece_ = absl::NullSafeStringView(", other_start=");
    local_90.piece_._M_str = (char *)CONCAT62(local_90.piece_._M_str._2_6_,0x3001);
    local_100._16_8_ = 0;
    local_100[0x18] = '\0';
    local_100[0x19] = '\0';
    local_100[0x1a] = '\0';
    local_100[0x1b] = '\0';
    local_100[0x1c] = '\0';
    local_100[0x1d] = '\0';
    local_100[0x1e] = '\0';
    local_100[0x1f] = '\0';
    local_100._8_8_ = 0;
    local_100._0_8_ = local_100 + 0x10;
    local_90.piece_._M_len = other_start;
    local_160._0_16_ =
         (undefined1  [16])
         absl::strings_internal::ExtractStringification<absl::Hex>
                   ((StringifySink *)local_100,(Hex *)&local_90);
    absl::StrAppend(__return_storage_ptr__,&local_130,(AlphaNum *)local_160);
    std::__cxx11::string::~string((string *)local_100);
  }
  std::__cxx11::string::~string((string *)&end);
  return __return_storage_ptr__;
}

Assistant:

static std::string EntryDebugString(uint64_t addr, uint64_t size,
                                      uint64_t other_start,
                                      const std::string& label) {
    std::string end =
        size == kUnknownSize ? "?" : absl::StrCat(absl::Hex(addr + size));
    std::string ret = absl::StrCat("[", absl::Hex(addr), ", ", end,
                                   "] (size=", absl::Hex(size), "): ", label);
    if (other_start != UINT64_MAX) {
      absl::StrAppend(&ret, ", other_start=", absl::Hex(other_start));
    }
    return ret;
  }